

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O2

void mxx::
     global_exscan_inplace<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::plus<int>>
               (int *begin,long end,comm *param_3)

{
  int iVar1;
  size_t i;
  ulong uVar2;
  long lVar3;
  int local_4c;
  comm nonzero_comm;
  
  comm::split(&nonzero_comm,param_3,(uint)(end - (long)begin != 0));
  lVar3 = end - (long)begin;
  if (lVar3 != 0) {
    iVar1 = *(int *)((long)begin + lVar3 + -4);
    local_exscan_inplace<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::plus<int>>
              (begin,end);
    local_4c = iVar1 + *(int *)((long)begin + lVar3 + -4);
    iVar1 = exscan<int,std::plus<int>>(&local_4c,&nonzero_comm,1);
    *begin = iVar1;
    for (uVar2 = 1; uVar2 < (ulong)(end - (long)begin >> 2); uVar2 = uVar2 + 1) {
      begin[uVar2] = begin[uVar2] + iVar1;
    }
  }
  comm::~comm(&nonzero_comm);
  return;
}

Assistant:

inline void global_exscan_inplace(Iterator begin, Iterator end, Func func, const mxx::comm& comm = mxx::comm()) {
    Iterator o = begin;
    size_t n = std::distance(begin, end);
    mxx::comm nonzero_comm = comm.split(n > 0);
    if (n > 0) {
        typedef typename std::iterator_traits<Iterator>::value_type T;
        T sum = *(begin+(n-1));
        // local inplace scan
        local_exscan_inplace(begin, end, func);
        sum += *(begin+(n-1));
        // mxx::exscan
        T presum = exscan(sum, func, nonzero_comm);
        *o++ = presum;
        // accumulate previous sum on all local elements
        for (size_t i = 1; i < n; ++i) {
            *o = func(presum, *o);
            ++o;
        }
    }
}